

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

void __thiscall cmCTestSubmitHandler::cmCTestSubmitHandler(cmCTestSubmitHandler *this)

{
  cmCTestSubmitHandler *this_local;
  
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCTestSubmitHandler_00c15de0;
  std::__cxx11::string::string((string *)&this->HTTPProxy);
  std::__cxx11::string::string((string *)&this->HTTPProxyAuth);
  std::__cxx11::string::string((string *)&this->FTPProxy);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Files);
  (*(this->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject[7])();
  return;
}

Assistant:

cmCTestSubmitHandler::cmCTestSubmitHandler() : HTTPProxy(), FTPProxy()
{
  this->Initialize();
}